

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_import_lite.pb.cc
# Opt level: O0

string * proto2_unittest_import::ImportEnumLite_Name_abi_cxx11_(ImportEnumLite value)

{
  int iVar1;
  string *local_30;
  int idx;
  ImportEnumLite value_local;
  
  if (ImportEnumLite_Name[abi:cxx11](proto2_unittest_import::ImportEnumLite)::kDummy == '\0') {
    iVar1 = __cxa_guard_acquire(&ImportEnumLite_Name[abi:cxx11](proto2_unittest_import::ImportEnumLite)
                                 ::kDummy);
    if (iVar1 != 0) {
      ImportEnumLite_Name::kDummy =
           google::protobuf::internal::InitializeEnumStrings
                     ((EnumEntry *)ImportEnumLite_entries,(int *)ImportEnumLite_entries_by_number,3,
                      (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                       *)ImportEnumLite_strings_abi_cxx11_);
      __cxa_guard_release(&ImportEnumLite_Name[abi:cxx11](proto2_unittest_import::ImportEnumLite)::
                           kDummy);
    }
  }
  iVar1 = google::protobuf::internal::LookUpEnumName
                    ((EnumEntry *)ImportEnumLite_entries,(int *)ImportEnumLite_entries_by_number,3,
                     value);
  if (iVar1 == -1) {
    local_30 = google::protobuf::internal::GetEmptyString_abi_cxx11_();
  }
  else {
    local_30 = google::protobuf::internal::
               ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
               ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                      *)(ImportEnumLite_strings_abi_cxx11_ + (long)iVar1 * 0x20));
  }
  return local_30;
}

Assistant:

const ::std::string& ImportEnumLite_Name(ImportEnumLite value) {
  static const bool kDummy = ::google::protobuf::internal::InitializeEnumStrings(
      ImportEnumLite_entries, ImportEnumLite_entries_by_number, 3,
      ImportEnumLite_strings);
  (void)kDummy;

  int idx = ::google::protobuf::internal::LookUpEnumName(ImportEnumLite_entries,
                                  ImportEnumLite_entries_by_number,
                                  3, value);
  return idx == -1 ? ::google::protobuf::internal::GetEmptyString() : ImportEnumLite_strings[idx].get();
}